

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pragma_queries.cpp
# Opt level: O3

string * __thiscall
duckdb::PragmaShow_abi_cxx11_
          (string *__return_storage_ptr__,duckdb *this,ClientContext *context,
          FunctionParameters *parameters)

{
  const_reference this_00;
  string local_30;
  
  this_00 = vector<duckdb::Value,_true>::operator[]((vector<duckdb::Value,_true> *)context,0);
  Value::ToString_abi_cxx11_(&local_30,this_00);
  PragmaShow(__return_storage_ptr__,&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

string PragmaShow(ClientContext &context, const FunctionParameters &parameters) {
	return PragmaShow(parameters.values[0].ToString());
}